

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor,
          bool immutable,bool kotlin)

{
  string local_50;
  
  anon_unknown_0::StripPackageName
            (&local_50,(string *)(*(long *)(descriptor + 8) + 0x20),
             *(FileDescriptor **)(descriptor + 0x10));
  GetClassFullName(__return_storage_ptr__,this,&local_50,*(FileDescriptor **)(descriptor + 0x10),
                   immutable,
                   *(bool *)(*(long *)(*(FileDescriptor **)(descriptor + 0x10) + 0x78) + 0x98),
                   kotlin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetClassName(const Descriptor* descriptor,
                                            bool immutable, bool kotlin) {
  return GetClassFullName(
      ClassNameWithoutPackage(descriptor, immutable), descriptor->file(),
      immutable, MultipleJavaFiles(descriptor->file(), immutable), kotlin);
}